

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::setupGlobals(TranslateToFuzzReader *this)

{
  Random *this_00;
  pointer puVar1;
  _Head_base<0UL,_wasm::Global_*,_false> _Var2;
  Module *module;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Expression *pEVar6;
  Type type;
  Global *global_00;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar7;
  anon_class_8_1_8991fb9c aVar8;
  bool bVar9;
  Name NVar10;
  Name name;
  string_view local_80;
  ulong local_70;
  Random *local_68;
  _Head_base<0UL,_wasm::Global_*,_false> local_60;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> global_2;
  anon_class_8_1_8991fb9c local_48;
  anon_class_8_1_8991fb9c useGlobalLater;
  
  puVar7 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  useGlobalLater.this = this;
  do {
    aVar8.this = useGlobalLater.this;
    if (puVar7 == puVar1) {
      local_48.this = this;
      if ((this->wasm->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->wasm->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_00 = &(useGlobalLater.this)->random;
        uVar4 = Random::upTo(this_00,100);
        puVar1 = ((aVar8.this)->wasm->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar7 = ((aVar8.this)->wasm->globals).
                      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1;
            puVar7 = puVar7 + 1) {
          uVar5 = Random::upTo(this_00,100);
          if (uVar5 < uVar4) {
            setupGlobals::anon_class_8_1_8991fb9c::operator()
                      (&local_48,
                       (puVar7->_M_t).
                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                       super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
          }
        }
      }
      aVar8.this = useGlobalLater.this;
      local_68 = &(useGlobalLater.this)->random;
      uVar4 = Random::upTo(local_68,((useGlobalLater.this)->fuzzParams->super_FuzzParams).
                                    MAX_GLOBALS);
      local_70 = (ulong)uVar4;
      do {
        bVar9 = local_70 == 0;
        local_70 = local_70 - 1;
        if (bVar9) {
          return;
        }
        type = getConcreteType(aVar8.this);
        Random::oneIn(local_68,3);
        pEVar6 = makeTrivial(aVar8.this,type);
        FindAll<wasm::RefAs>::FindAll((FindAll<wasm::RefAs> *)&stack0xffffffffffffffa0,pEVar6);
        uVar3 = global_2;
        _Var2._M_head_impl = local_60._M_head_impl;
        std::_Vector_base<wasm::RefAs_*,_std::allocator<wasm::RefAs_*>_>::~_Vector_base
                  ((_Vector_base<wasm::RefAs_*,_std::allocator<wasm::RefAs_*>_> *)
                   &stack0xffffffffffffffa0);
        if ((__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
            _Var2._M_head_impl ==
            (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)
            uVar3._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl) {
          if (((type.id & 1) != 0 && 6 < type.id) && (pEVar6->_id != TupleMakeId)) {
            pEVar6 = makeConst(useGlobalLater.this,type);
            if (pEVar6->_id != TupleMakeId) {
              __assert_fail("init->is<TupleMake>()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                            ,0x2b7,"void wasm::TranslateToFuzzReader::setupGlobals()");
            }
          }
        }
        else {
          type = getMVPType(aVar8.this);
          pEVar6 = makeConst(aVar8.this,type);
        }
        module = (useGlobalLater.this)->wasm;
        Name::Name((Name *)&local_80,"global$");
        aVar8 = useGlobalLater;
        NVar10 = Names::getValidGlobalName(module,(Name)local_80);
        name.super_IString.str._M_str = NVar10.super_IString.str._M_len;
        name.super_IString.str._M_len = (size_t)&stack0xffffffffffffffa0;
        Builder::makeGlobal(name,(Type)NVar10.super_IString.str._M_str,(Expression *)type.id,
                            (Mutability)pEVar6);
        global_00 = (Global *)::wasm::Module::addGlobal((unique_ptr *)(aVar8.this)->wasm);
        setupGlobals::anon_class_8_1_8991fb9c::operator()(&local_48,global_00);
        std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                  ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                   &stack0xffffffffffffffa0);
      } while( true );
    }
    _Var2._M_head_impl =
         (puVar7->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
      if (((this->wasm->features).features & 0x400) == 0) {
        FindAll<wasm::GlobalGet>::FindAll
                  ((FindAll<wasm::GlobalGet> *)&stack0xffffffffffffffa0,(_Var2._M_head_impl)->init);
        uVar3 = global_2;
        _Var2._M_head_impl = local_60._M_head_impl;
        std::_Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::~_Vector_base
                  ((_Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_> *)
                   &stack0xffffffffffffffa0);
        this = useGlobalLater.this;
        if ((__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
            _Var2._M_head_impl !=
            (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)
            uVar3._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl) goto LAB_0015b1a8;
      }
    }
    else if (this->preserveImportsAndExports == false) {
      *(undefined8 *)
       &((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x28))->super_IString = 0;
      *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x30) = (char *)0x0;
      _Var2._M_head_impl =
           (puVar7->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      *(undefined8 *)
       &((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x18))->super_IString = 0;
      *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20) = (char *)0x0;
LAB_0015b1a8:
      pEVar6 = makeConst(this,(Type)(((puVar7->_M_t).
                                      super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                      .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->
                                    type).id);
      ((puVar7->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
       super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init = pEVar6;
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

void TranslateToFuzzReader::setupGlobals() {
  // If there were initial wasm contents, there may be imported globals. That
  // would be a problem in the fuzzer harness as we'd error if we do not
  // provide them (and provide the proper type, etc.).
  // Avoid that, so that all the standard fuzzing infrastructure can always
  // run the wasm.
  for (auto& global : wasm.globals) {
    if (global->imported()) {
      if (!preserveImportsAndExports) {
        // Remove import info from imported globals, and give them a simple
        // initializer.
        global->module = global->base = Name();
        global->init = makeConst(global->type);
      }
    } else {
      // If the initialization referred to an imported global, it no longer can
      // point to the same global after we make it a non-imported global unless
      // GC is enabled, since before GC, Wasm only made imported globals
      // available in constant expressions.
      if (!wasm.features.hasGC() &&
          !FindAll<GlobalGet>(global->init).list.empty()) {
        global->init = makeConst(global->type);
      }
    }
  }

  auto useGlobalLater = [&](Global* global) {
    auto type = global->type;
    auto name = global->name;
    globalsByType[type].push_back(name);
    if (global->mutable_) {
      mutableGlobalsByType[type].push_back(name);
    } else {
      immutableGlobalsByType[type].push_back(name);
      if (global->imported()) {
        importedImmutableGlobalsByType[type].push_back(name);
      }
    }
  };

  // Randomly assign some globals from initial content to be ignored for the
  // fuzzer to use. Such globals will only be used from initial content. This is
  // important to preserve some real-world patterns, like the "once" pattern in
  // which a global is used in one function only. (If we randomly emitted gets
  // and sets of such globals, we'd with very high probability end up breaking
  // that pattern, and not fuzzing it at all.)
  if (!wasm.globals.empty()) {
    unsigned percentUsedInitialGlobals = upTo(100);
    for (auto& global : wasm.globals) {
      if (upTo(100) < percentUsedInitialGlobals) {
        useGlobalLater(global.get());
      }
    }
  }

  // Create new random globals.
  for (size_t index = upTo(fuzzParams->MAX_GLOBALS); index > 0; --index) {
    auto type = getConcreteType();
    // Prefer immutable ones as they can be used in global.gets in other
    // globals, for more interesting patterns.
    auto mutability = oneIn(3) ? Builder::Mutable : Builder::Immutable;

    // We can only make something trivial (like a constant) in a global
    // initializer.
    auto* init = makeTrivial(type);

    if (!FindAll<RefAs>(init).list.empty()) {
      // When creating this initial value we ended up emitting a RefAs, which
      // means we had to stop in the middle of an overly-nested struct or array,
      // which we can break out of using ref.as_non_null of a nullable ref. That
      // traps in normal code, which is bad enough, but it does not even
      // validate in a global. Switch to something safe instead.
      type = getMVPType();
      init = makeConst(type);
    } else if (type.isTuple() && !init->is<TupleMake>()) {
      // For now we disallow anything but tuple.make at the top level of tuple
      // globals (see details in wasm-binary.cpp). In the future we may allow
      // global.get or other things here.
      init = makeConst(type);
      assert(init->is<TupleMake>());
    }
    auto global = builder.makeGlobal(
      Names::getValidGlobalName(wasm, "global$"), type, init, mutability);
    useGlobalLater(wasm.addGlobal(std::move(global)));
  }
}